

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  ushort uVar2;
  bool bVar3;
  Vdbe *pVVar4;
  int iVar5;
  uint uVar6;
  char **p;
  char *pcVar7;
  uchar *puVar8;
  Mem *pMVar9;
  char **ppcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_70;
  char **local_68;
  uint local_5c;
  char *local_58;
  sqlite3 *local_50;
  sqlite3_callback local_48;
  ulong local_40;
  void *local_38;
  
  local_70 = (Vdbe *)0x0;
  local_48 = xCallback;
  local_38 = pArg;
  iVar5 = sqlite3SafetyCheckOk(db);
  if (iVar5 == 0) {
    uVar6 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1b520,
                "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  }
  else {
    pcVar7 = "";
    if (zSql != (char *)0x0) {
      pcVar7 = zSql;
    }
    local_68 = pzErrMsg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    local_50 = db;
    if (db->pErr != (sqlite3_value *)0x0) {
      sqlite3ErrorFinish(db,0);
    }
    while( true ) {
      if (*pcVar7 == '\0') break;
      local_70 = (Vdbe *)0x0;
      uVar6 = sqlite3LockAndPrepare
                        (db,pcVar7,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_70,&local_58);
      if (uVar6 != 0) goto LAB_0011d9b4;
      if (local_70 == (Vdbe *)0x0) {
        uVar6 = 0;
        pcVar7 = local_58;
      }
      else {
        uVar2 = local_70->nResColumn;
        uVar12 = (ulong)uVar2;
        local_40 = (ulong)uVar2 << 4 | 8;
        p = (char **)0x0;
        bVar3 = false;
        ppcVar10 = (char **)0x0;
        do {
          uVar6 = sqlite3_step((sqlite3_stmt *)local_70);
          if (local_48 != (sqlite3_callback)0x0) {
            local_5c = uVar6;
            if (uVar6 == 100) {
              if (!bVar3) goto LAB_0011d7b4;
LAB_0011d7fe:
              ppcVar10 = p + uVar12;
              if (uVar12 == 0) {
                uVar13 = 0;
              }
              else {
                uVar11 = 0;
                do {
                  puVar8 = sqlite3_column_text((sqlite3_stmt *)local_70,(int)uVar11);
                  pVVar4 = local_70;
                  ppcVar10[uVar11] = (char *)puVar8;
                  if (puVar8 == (uchar *)0x0) {
                    pMVar9 = columnMem((sqlite3_stmt *)local_70,(int)uVar11);
                    uVar6._0_2_ = pMVar9->flags;
                    uVar6._2_1_ = pMVar9->enc;
                    uVar6._3_1_ = pMVar9->eSubtype;
                    columnMallocFailure((sqlite3_stmt *)pVVar4);
                    if ((0xaaaaaaaaU >> (uVar6 & 0x1f) & 1) == 0) {
                      uVar6 = 100;
                      db = local_50;
                      if ((local_50->mallocFailed == '\0') &&
                         (uVar6 = 100, local_50->bBenignMalloc == '\0')) {
                        local_50->mallocFailed = '\x01';
                        if (0 < local_50->nVdbeExec) {
                          (local_50->u1).isInterrupted = 1;
                        }
                        (local_50->lookaside).bDisable = (local_50->lookaside).bDisable + 1;
                      }
                      goto LAB_0011d9bc;
                    }
                  }
                  uVar11 = uVar11 + 1;
                  uVar13 = uVar12;
                  db = local_50;
                } while (uVar12 != uVar11);
              }
              ppcVar10[uVar13] = (char *)0x0;
            }
            else {
              if (((uVar6 != 0x65) || (bVar3)) || ((db->flags & 0x100) == 0)) break;
LAB_0011d7b4:
              p = (char **)sqlite3DbMallocRawNN(db,local_40);
              pVVar4 = local_70;
              if (p == (char **)0x0) {
                p = (char **)0x0;
                uVar6 = local_5c;
                goto LAB_0011d9bc;
              }
              if (uVar12 != 0) {
                uVar13 = 0;
                do {
                  pcVar7 = sqlite3_column_name((sqlite3_stmt *)pVVar4,(int)uVar13);
                  p[uVar13] = pcVar7;
                  uVar13 = uVar13 + 1;
                } while (uVar12 != uVar13);
              }
              db = local_50;
              if (local_5c == 100) goto LAB_0011d7fe;
            }
            iVar5 = (*local_48)(local_38,(uint)uVar2,ppcVar10,p);
            bVar3 = true;
            uVar6 = local_5c;
            if (iVar5 != 0) {
              sqlite3VdbeFinalize(local_70);
              local_70 = (Vdbe *)0x0;
              db->errCode = 4;
              sqlite3ErrorFinish(db,4);
              uVar6 = 4;
              goto LAB_0011d9bc;
            }
          }
        } while (uVar6 == 100);
        uVar6 = sqlite3VdbeFinalize(local_70);
        local_70 = (Vdbe *)0x0;
        pcVar7 = local_58 + -1;
        do {
          pbVar1 = (byte *)(pcVar7 + 1);
          pcVar7 = pcVar7 + 1;
        } while ((""[*pbVar1] & 1) != 0);
        if (p != (char **)0x0) {
          sqlite3DbFreeNN(db,p);
        }
      }
      if (uVar6 != 0) goto LAB_0011d9b4;
    }
    uVar6 = 0;
LAB_0011d9b4:
    p = (char **)0x0;
LAB_0011d9bc:
    ppcVar10 = local_68;
    if (local_70 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_70);
    }
    if (p != (char **)0x0) {
      sqlite3DbFreeNN(db,p);
    }
    if ((uVar6 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar6 = 7;
    }
    else {
      uVar6 = uVar6 & db->errMask;
    }
    if ((ppcVar10 == (char **)0x0) || (uVar6 == 0)) {
      if (ppcVar10 != (char **)0x0) {
        *ppcVar10 = (char *)0x0;
      }
    }
    else {
      pcVar7 = sqlite3_errmsg(db);
      pcVar7 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar7);
      *ppcVar10 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        db->errCode = 7;
        uVar6 = 7;
        sqlite3ErrorFinish(db,7);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar6;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}